

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
DeviceLinkNode::Evaluate
          (string *__return_storage_ptr__,DeviceLinkNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  static_string_view *psVar2;
  anon_class_16_2_bd2eff0b_for__M_pred pred;
  allocator<char> local_81;
  string local_80;
  cmList list;
  static_string_view DL_BEGIN;
  static_string_view DL_END;
  
  if (((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
      (context->HeadTarget == (cmGeneratorTarget *)0x0)) ||
     (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptionsExpression(dagChecker), !bVar1))
  {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&list,
               "$<DEVICE_LINK:...> may only be used with binary targets to specify link options.",
               (allocator<char> *)&DL_BEGIN);
    reportError(context,&local_80,(string *)&list);
    std::__cxx11::string::~string((string *)&list);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else if (context->HeadTarget->DeviceLink == true) {
    psVar2 = (static_string_view *)0x1;
    cmList::
    cmList<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&list,(parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
               (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,Yes,No);
    DL_BEGIN.super_string_view._M_len = 0xd;
    DL_BEGIN.super_string_view._M_str = "<DEVICE_LINK>";
    DL_END.super_string_view._M_len = 0xe;
    DL_END.super_string_view._M_str = "</DEVICE_LINK>";
    pred.DL_END = psVar2;
    pred.DL_BEGIN = &DL_END;
    ::cm::
    erase_if<DeviceLinkNode::Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)const::_lambda(std::__cxx11::string_const&)_1_>
              ((cm *)&list,(cmList *)&DL_BEGIN,pred);
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,&DL_BEGIN,&local_81);
    cmList::Insert(&list.Values,
                   (const_iterator)
                   list.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_80,Yes,No);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<cm::static_string_view,void>((string *)&local_80,&DL_END,&local_81)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,&local_80)
    ;
    std::__cxx11::string::~string((string *)&local_80);
    cmList::to_string_abi_cxx11_(__return_storage_ptr__,&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list.Values);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget || !dagChecker ||
        !dagChecker->EvaluatingLinkOptionsExpression()) {
      reportError(context, content->GetOriginalExpression(),
                  "$<DEVICE_LINK:...> may only be used with binary targets "
                  "to specify link options.");
      return std::string();
    }

    if (context->HeadTarget->IsDeviceLink()) {
      cmList list{ parameters.begin(), parameters.end() };
      const auto DL_BEGIN = "<DEVICE_LINK>"_s;
      const auto DL_END = "</DEVICE_LINK>"_s;
      cm::erase_if(list, [&](const std::string& item) {
        return item == DL_BEGIN || item == DL_END;
      });

      list.insert(list.begin(), static_cast<std::string>(DL_BEGIN));
      list.push_back(static_cast<std::string>(DL_END));

      return list.to_string();
    }

    return std::string();
  }